

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

int catenate(Global *global,ReturnCode *ret)

{
  int iVar1;
  uint uVar2;
  ReturnCode RVar3;
  Global *global_00;
  size_t sVar4;
  ushort **ppuVar5;
  Global *in_RSI;
  Global *in_RDI;
  char *token1;
  int c;
  Global *global_01;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = get(in_RSI);
  if (iVar1 != 0x1e) {
    unget((Global *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    return 0;
  }
  global_00 = (Global *)
              savestring((Global *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8);
  uVar2 = get(in_RSI);
  if (in_RDI->rightconcat == '\0') {
    lookid((Global *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
           (int)((ulong)in_RDI >> 0x20));
  }
  else {
    RVar3 = macroid(global_00,(int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    in_RSI->line = RVar3;
    if (in_RSI->line != 0) {
      return 0;
    }
  }
  iVar1 = (int)type[(int)uVar2];
  if (iVar1 != 1) {
    if (iVar1 == 2) {
      sVar4 = strlen((char *)global_00);
      iVar1 = (int)sVar4;
      sVar4 = strlen(in_RDI->tokenbuf);
      if (0x1ff < iVar1 + (int)sVar4) {
        cerror(in_RDI,FATAL_WORK_AREA_OVERFLOW,global_00);
        in_RSI->line = 7;
        return 0;
      }
      sprintf(in_RDI->work,"%s%s",global_00,in_RDI->tokenbuf);
      goto LAB_0010904f;
    }
    if (iVar1 != 0x42) {
      ppuVar5 = __ctype_b_loc();
      if (((*ppuVar5)[(int)uVar2] & 0x4000) == 0) {
        cerror(in_RDI,ERROR_STRANG_CHARACTER2,(ulong)uVar2);
      }
      else {
        cerror(in_RDI,ERROR_STRANG_CHARACTER,(ulong)uVar2);
      }
      strcpy(in_RDI->work,(char *)global_00);
      unget((Global *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
      goto LAB_0010904f;
    }
  }
  strcpy(in_RDI->work,(char *)global_00);
  global_01 = (Global *)in_RDI->work;
  sVar4 = strlen(in_RDI->work);
  in_RDI->workp = global_01->work + (sVar4 - 0x40);
  RVar3 = scannumber((Global *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (int)((ulong)in_RDI >> 0x20),(_func_ReturnCode_Global_ptr_int *)in_RSI);
  in_RSI->line = RVar3;
  if (in_RSI->line != 0) {
    return 0;
  }
  RVar3 = save(global_01,0);
  in_RSI->line = RVar3;
  if (in_RSI->line != 0) {
    return 0;
  }
LAB_0010904f:
  Freemem((void *)0x109059);
  RVar3 = ungetstring((Global *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),(char *)global_00);
  in_RSI->line = RVar3;
  return (uint)(in_RSI->line == 0);
}

Assistant:

int catenate(struct Global *global, ReturnCode *ret)
{
  /*
   * A token was just read (via macroid).
   * If the next character is TOK_SEP, concatenate the next token
   * return TRUE -- which should recall macroid after refreshing
   * macroid's argument.  If it is not TOK_SEP, unget() the character
   * and return FALSE.
   */

#if OK_CONCAT
  int c;
  char *token1;
#endif
  
#if OK_CONCAT
  if (get(global) != TOK_SEP) {                 /* Token concatenation  */
    unget(global);
    return (FALSE);
  }
  else {
    token1 = savestring(global, global->tokenbuf); /* Save first token     */
    c=get(global);
    if(global->rightconcat) {
      *ret=macroid(global, &c);           /* Scan next token      */
      if(*ret)
	return(FALSE);
    } else
      lookid(global, c);
    switch(type[c]) {                   /* What was it?         */
    case LET:				/* An identifier, ...	*/
      if ((int)strlen(token1) + (int)strlen(global->tokenbuf) >= NWORK) {
	cfatal(global, FATAL_WORK_AREA_OVERFLOW, token1);
	*ret=FPP_WORK_AREA_OVERFLOW;
	return(FALSE);
      }
      sprintf(global->work, "%s%s", token1, global->tokenbuf);
      break;
    case DIG:				/* A number		*/
    case DOT:				/* Or maybe a float	*/
      strcpy(global->work, token1);
      global->workp = global->work + strlen(global->work);
      *ret=scannumber(global, c, save);
      if(*ret)
	return(FALSE);
      *ret=save(global, EOS);
      if(*ret)
	return(FALSE);
      break;
    default:				/* An error, ...	*/
      if (isprint(c))
	cerror(global, ERROR_STRANG_CHARACTER, c);
      else
	cerror(global, ERROR_STRANG_CHARACTER2, c);
      strcpy(global->work, token1);
      unget(global);
      break;
    }
    /*
     * work has the concatenated token and token1 has
     * the first token (no longer needed).  Unget the
     * new (concatenated) token after freeing token1.
     * Finally, setup to read the new token.
     */
    Freemem(token1);                        /* Free up memory       */
    *ret=ungetstring(global, global->work);  /* Unget the new thing, */
    if(*ret)
      return(FALSE);
    return(TRUE);
  }
#else
  return(FALSE);                    /* Not supported        */
#endif
}